

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseCompiler::_newReg(BaseCompiler *this,BaseReg *out,TypeId typeId,char *name)

{
  undefined4 uVar1;
  Error EVar2;
  undefined1 in_DL;
  TypeId *in_RSI;
  char *in_RDI;
  Error _err;
  VirtReg *vReg;
  Error err;
  OperandSignature regSignature;
  Error in_stack_ffffffffffffff7c;
  BaseEmitter *in_stack_ffffffffffffff80;
  undefined4 local_74;
  undefined7 in_stack_ffffffffffffff98;
  Error local_4c;
  char *name_00;
  char *pcVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  BaseCompiler *in_stack_ffffffffffffffd8;
  OperandSignature in_stack_ffffffffffffffe0;
  
  in_RSI[0] = kVoid;
  in_RSI[1] = kVoid;
  in_RSI[2] = kVoid;
  in_RSI[3] = kVoid;
  in_RSI[4] = kVoid;
  in_RSI[5] = kVoid;
  in_RSI[6] = kVoid;
  in_RSI[7] = kVoid;
  in_RSI[8] = kVoid;
  in_RSI[9] = kVoid;
  in_RSI[10] = kVoid;
  in_RSI[0xb] = kVoid;
  in_RSI[0xc] = kVoid;
  in_RSI[0xd] = kVoid;
  in_RSI[0xe] = kVoid;
  in_RSI[0xf] = kVoid;
  name_00 = in_RDI;
  pcVar3 = in_RDI;
  EVar2 = ArchUtils::typeIdToRegSignature
                    ((Arch)((ulong)in_RDI >> 0x38),(TypeId)((ulong)in_RDI >> 0x30),in_RSI,
                     (OperandSignature *)CONCAT17(in_DL,in_stack_ffffffffffffff98));
  if (EVar2 == 0) {
    local_4c = newVirtReg(in_stack_ffffffffffffffd8,
                          (VirtReg **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          (TypeId)((ulong)pcVar3 >> 0x38),in_stack_ffffffffffffffe0,name_00);
    if (local_4c == 0) {
      uVar1 = *(undefined4 *)((long)&in_stack_ffffffffffffff80->_vptr_BaseEmitter + 4);
      *(undefined4 *)in_RSI = local_74;
      *(undefined4 *)(in_RSI + 4) = uVar1;
      in_RSI[8] = kVoid;
      in_RSI[9] = kVoid;
      in_RSI[10] = kVoid;
      in_RSI[0xb] = kVoid;
      in_RSI[0xc] = kVoid;
      in_RSI[0xd] = kVoid;
      in_RSI[0xe] = kVoid;
      in_RSI[0xf] = kVoid;
      local_4c = 0;
    }
  }
  else {
    local_4c = BaseEmitter::reportError(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_RDI);
  }
  return local_4c;
}

Assistant:

Error BaseCompiler::_newReg(BaseReg* out, TypeId typeId, const char* name) {
  OperandSignature regSignature;
  out->reset();

  Error err = ArchUtils::typeIdToRegSignature(arch(), typeId, &typeId, &regSignature);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  VirtReg* vReg;
  ASMJIT_PROPAGATE(newVirtReg(&vReg, typeId, regSignature, name));
  ASMJIT_ASSUME(vReg != nullptr);

  out->_initReg(regSignature, vReg->id());
  return kErrorOk;
}